

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall
QFormLayoutPrivate::setWidget(QFormLayoutPrivate *this,int row,ItemRole role,QWidget *widget)

{
  bool bVar1;
  QWidgetItem *pQVar2;
  long in_RCX;
  QFormLayoutPrivate *in_RDI;
  QLayout *unaff_retaddr;
  ItemRole in_stack_00000008;
  int in_stack_0000000c;
  QWidgetItem *item;
  QFormLayout *q;
  QLayout *in_stack_ffffffffffffffd8;
  QFormLayoutPrivate *w;
  
  if (in_RCX != 0) {
    w = in_RDI;
    q_func(in_RDI);
    QLayout::addChildWidget(unaff_retaddr,(QWidget *)w);
    pQVar2 = QLayoutPrivate::createWidgetItem(in_stack_ffffffffffffffd8,(QWidget *)in_RDI);
    bVar1 = setItem((QFormLayoutPrivate *)item,in_stack_0000000c,in_stack_00000008,
                    (QLayoutItem *)unaff_retaddr);
    if ((!bVar1) && (pQVar2 != (QWidgetItem *)0x0)) {
      (*(pQVar2->super_QLayoutItem)._vptr_QLayoutItem[1])();
    }
  }
  return;
}

Assistant:

void QFormLayoutPrivate::setWidget(int row, QFormLayout::ItemRole role, QWidget *widget)
{
    if (widget) {
        Q_Q(QFormLayout);
        q->addChildWidget(widget);
        QWidgetItem *item = QLayoutPrivate::createWidgetItem(q, widget);
        if (!setItem(row, role, item))
            delete item;
    }
}